

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

Statement *
slang::ast::WaitOrderStatement::fromSyntax
          (Compilation *compilation,WaitOrderStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SyntaxNode *this;
  Type *this_00;
  StatementSyntax *pSVar1;
  ElseClauseSyntax *pEVar2;
  bool bVar3;
  int iVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  Expression *this_01;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  WaitOrderStatement *stmt;
  socklen_t __len;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  ASTContext *src;
  ASTContext *extraout_RDX_01;
  ASTContext *extraout_RDX_02;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  SourceRange sourceRange;
  Statement *ifFalse;
  Statement *ifTrue;
  SmallVector<const_slang::ast::Expression_*,_5UL> events;
  Statement *local_b0;
  Statement *local_a8;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_a0;
  StatementContext *local_90;
  WaitOrderStatement *local_88;
  SmallVectorBase<const_slang::ast::Expression_*> local_80 [2];
  SourceRange local_40;
  undefined4 extraout_var;
  
  local_80[0].data_ = (pointer)local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 5;
  uVar7 = (syntax->names).elements._M_extent._M_extent_value + 1;
  bVar8 = uVar7 < 2;
  src = context;
  local_90 = stmtCtx;
  if (!bVar8) {
    uVar7 = uVar7 >> 1;
    lVar6 = 0;
    do {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->names).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar6));
      this = *ppSVar5;
      iVar4 = Expression::bind((int)this,(sockaddr *)context,0);
      this_01 = (Expression *)CONCAT44(extraout_var,iVar4);
      bVar3 = Expression::bad(this_01);
      if (bVar3) {
LAB_0044b257:
        bVar3 = false;
        local_88 = (WaitOrderStatement *)Statement::badStmt(compilation,(Statement *)0x0);
        src = extraout_RDX_00;
      }
      else {
        this_00 = (this_01->type).ptr;
        if (this_00->canonical == (Type *)0x0) {
          Type::resolveCanonical(this_00);
        }
        if ((this_00->canonical->super_Symbol).kind != EventType) {
          sourceRange = slang::syntax::SyntaxNode::sourceRange(this);
          ASTContext::addDiag(context,(DiagCode)0x310008,sourceRange);
          goto LAB_0044b257;
        }
        local_a0._M_ptr = (pointer)this_01;
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_80,
                   (Expression **)&local_a0);
        bVar3 = true;
        src = extraout_RDX;
      }
      if (!bVar3) break;
      lVar6 = lVar6 + 0x30;
      uVar7 = uVar7 - 1;
      bVar8 = uVar7 == 0;
    } while (!bVar8);
  }
  stmt = local_88;
  if (bVar8) {
    local_a8 = (Statement *)0x0;
    local_b0 = (Statement *)0x0;
    pSVar1 = ((syntax->action).ptr)->statement;
    __len = (socklen_t)local_90;
    if (pSVar1 != (StatementSyntax *)0x0) {
      iVar4 = Statement::bind((int)pSVar1,(sockaddr *)context,__len);
      local_a8 = (Statement *)CONCAT44(extraout_var_00,iVar4);
      src = extraout_RDX_01;
    }
    pEVar2 = ((syntax->action).ptr)->elseClause;
    if (pEVar2 != (ElseClauseSyntax *)0x0) {
      iVar4 = Statement::bind((int)(pEVar2->clause).ptr,(sockaddr *)context,__len);
      local_b0 = (Statement *)CONCAT44(extraout_var_01,iVar4);
      src = extraout_RDX_02;
    }
    iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_80,(EVP_PKEY_CTX *)compilation,(EVP_PKEY_CTX *)src);
    local_a0._M_ptr = (pointer)CONCAT44(extraout_var_02,iVar4);
    local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    stmt = BumpAllocator::
           emplace<slang::ast::WaitOrderStatement,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
                     (&compilation->super_BumpAllocator,&local_a0,&local_a8,&local_b0,&local_40);
    bVar8 = ASTContext::requireTimingAllowed(context,(stmt->super_Statement).sourceRange);
    if (!bVar8) {
      stmt = (WaitOrderStatement *)Statement::badStmt(compilation,&stmt->super_Statement);
    }
  }
  if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
    operator_delete(local_80[0].data_);
  }
  return &stmt->super_Statement;
}

Assistant:

Statement& WaitOrderStatement::fromSyntax(Compilation& compilation,
                                          const WaitOrderStatementSyntax& syntax,
                                          const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> events;
    for (auto name : syntax.names) {
        auto& ev = Expression::bind(*name, context);
        if (ev.bad())
            return badStmt(compilation, nullptr);

        if (!ev.type->isEvent()) {
            context.addDiag(diag::NotAnEvent, name->sourceRange());
            return badStmt(compilation, nullptr);
        }

        events.push_back(&ev);
    }

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    auto result = compilation.emplace<WaitOrderStatement>(events.copy(compilation), ifTrue, ifFalse,
                                                          syntax.sourceRange());

    if (!context.requireTimingAllowed(result->sourceRange))
        return badStmt(compilation, result);

    return *result;
}